

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageDrawText(Image *dst,char *text,int posX,int posY,int fontSize,Color color)

{
  Font font;
  Vector2 position;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  position.x = (float)posX;
  position.y = (float)posY;
  GetFontDefault();
  font._8_8_ = uStack_50;
  font._0_8_ = local_58;
  font.texture._4_8_ = local_48;
  font.texture._12_8_ = uStack_40;
  font.recs = (Rectangle *)local_38;
  font.chars = uStack_30;
  ImageDrawTextEx(dst,font,text,position,(float)fontSize,(float)fontSize / 10.0,color);
  return;
}

Assistant:

void ImageDrawText(Image *dst, const char *text, int posX, int posY, int fontSize, Color color)
{
    Vector2 position = { (float)posX, (float)posY };

    // NOTE: For default font, sapcing is set to desired font size / default font size (10)
    ImageDrawTextEx(dst, GetFontDefault(), text, position, (float)fontSize, (float)fontSize/10, color);
}